

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::~vector
          (vector<basist::ktx2_transcoder::key_value> *this)

{
  uint uVar1;
  void *pvVar2;
  key_value *__ptr;
  long lVar3;
  
  __ptr = this->m_p;
  if (__ptr != (key_value *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&(__ptr->m_value).m_p + lVar3);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        pvVar2 = *(void **)((long)&(__ptr->m_key).m_p + lVar3);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar3 = lVar3 + 0x20;
      } while ((ulong)uVar1 << 5 != lVar3);
      __ptr = this->m_p;
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }